

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O3

vector_type * __thiscall
nanoNet::NeuralNetworkLayer::predict
          (vector_type *__return_storage_ptr__,NeuralNetworkLayer *this,vector_type *inputData)

{
  size_t sVar1;
  size_t sVar2;
  pointer pvVar3;
  pointer pfVar4;
  long lVar5;
  float *pfVar6;
  size_t sVar7;
  size_t sVar8;
  float *value;
  float *pfVar9;
  float fVar10;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,&this->m_biases);
  sVar1 = this->m_outputCount;
  pfVar9 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar1 != 0) {
    sVar2 = this->m_inputCount;
    pvVar3 = (this->m_weights).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar4 = (inputData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar7 = 0;
    do {
      if (sVar2 != 0) {
        lVar5 = *(long *)&pvVar3[sVar7].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data;
        fVar10 = pfVar9[sVar7];
        sVar8 = 0;
        do {
          fVar10 = fVar10 + *(float *)(lVar5 + sVar8 * 4) * pfVar4[sVar8];
          pfVar9[sVar7] = fVar10;
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != sVar1);
    pfVar9 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  pfVar6 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar9 != pfVar6) {
    do {
      fVar10 = ActivationFunction::operator()(&this->m_activationFunction,*pfVar9);
      *pfVar9 = fVar10;
      pfVar9 = pfVar9 + 1;
    } while (pfVar9 != pfVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetworkLayer::predict(const vector_type& inputData) const
{
    vector_type result(m_biases);

    for (std::size_t i = 0; i < m_outputCount; i++)
        for (std::size_t j = 0; j < m_inputCount; j++)
            result[i] += m_weights[i][j] * inputData[j];

    for (auto& value : result)
        value = m_activationFunction(value);

    return result;
}